

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_add_uint(tnt_stream *s,uint64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  size_t sVar5;
  uint uVar6;
  char local_12;
  undefined1 auStack_11 [7];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (value < 0x80) {
    sVar5 = 1;
    local_12 = (char)value;
  }
  else if (value < 0x100) {
    local_12 = -0x34;
    _auStack_11 = CONCAT71(stack0xfffffffffffffff0,(char)value);
    sVar5 = 2;
  }
  else if (value < 0x10000) {
    local_12 = -0x33;
    _auStack_11 = CONCAT62(stack0xfffffffffffffff1,(ushort)value << 8 | (ushort)value >> 8);
    sVar5 = 3;
  }
  else if (value >> 0x20 == 0) {
    local_12 = -0x32;
    uVar6 = (uint)value;
    _auStack_11 = CONCAT44(stack0xfffffffffffffff3,
                           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                           uVar6 << 0x18);
    sVar5 = 5;
  }
  else {
    local_12 = -0x31;
    _auStack_11 = value >> 0x38 | (value & 0xff000000000000) >> 0x28 |
                  (value & 0xff0000000000) >> 0x18 | (value & 0xff00000000) >> 8 |
                  (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 | (value & 0xff00) << 0x28
                  | value << 0x38;
    sVar5 = 9;
  }
  sVar4 = (*s->write)(s,&local_12,sVar5);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_uint(struct tnt_stream *s, uint64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}